

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O3

string * __thiscall
cmFindPathCommand::FindFrameworkHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer dir;
  pointer file;
  
  file = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (file != pbVar2) {
    pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      dir = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if (dir != pbVar3) {
        do {
          FindHeaderInFramework(__return_storage_ptr__,this,file,dir);
          if (__return_storage_ptr__->_M_string_length != 0) {
            return __return_storage_ptr__;
          }
          pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &__return_storage_ptr__->field_2) {
            operator_delete(pcVar1,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
          }
          pbVar3 = dir + 1;
          dir = pbVar3;
        } while (pbVar3 != (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        pbVar2 = (this->super_cmFindBase).Names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      file = file + 1;
    } while (file != pbVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindFrameworkHeader()
{
  for (std::vector<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    for (std::vector<std::string>::const_iterator p =
           this->SearchPaths.begin();
         p != this->SearchPaths.end(); ++p) {
      std::string fwPath = this->FindHeaderInFramework(*ni, *p);
      if (!fwPath.empty()) {
        return fwPath;
      }
    }
  }
  return "";
}